

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O1

UINT8 device_start_saa1099_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT8 UVar2;
  saa1099_state *saa;
  DEV_DATA DVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((uVar5 = uVar1 >> 7, cfg->srMode == '\x02' && (uVar5 < cfg->smplRate)))) {
    uVar5 = cfg->smplRate;
  }
  DVar3.chipInf = calloc(1,0x168);
  if (DVar3.chipInf == (void *)0x0) {
    DVar3.chipInf = (void *)0x0;
  }
  else {
    *(uint *)((long)DVar3.chipInf + 0x160) = uVar1;
    *(double *)((long)DVar3.chipInf + 0x158) = (double)uVar5;
    lVar4 = 0x59;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0x149);
  }
  if (DVar3.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef_SAA1099_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_saa1099_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;	// /128 seems right based on the highest noise frequency
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099m_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_MAME);
	return 0x00;
}